

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_parse_set_filename(ly_ctx *ctx,char **filename,int fd)

{
  ssize_t sVar1;
  char *pcVar2;
  char local_1048 [8];
  char proc_path [32];
  char path [4096];
  int len;
  int fd_local;
  char **filename_local;
  ly_ctx *ctx_local;
  
  sprintf(local_1048,"/proc/self/fd/%d",(ulong)(uint)fd);
  sVar1 = readlink(local_1048,proc_path + 0x18,0xfff);
  if (0 < (int)sVar1) {
    pcVar2 = lydict_insert(ctx,proc_path + 0x18,(long)(int)sVar1);
    *filename = pcVar2;
  }
  return;
}

Assistant:

static void
lys_parse_set_filename(struct ly_ctx *ctx, const char **filename, int fd)
{
#ifdef __APPLE__
    char path[MAXPATHLEN];
#else
    int len;
    char path[PATH_MAX], proc_path[32];
#endif

#ifdef __APPLE__
    if (fcntl(fd, F_GETPATH, path) != -1) {
        *filename = lydict_insert(ctx, path, 0);
    }
#else
    /* get URI if there is /proc */
    sprintf(proc_path, "/proc/self/fd/%d", fd);
    if ((len = readlink(proc_path, path, PATH_MAX - 1)) > 0) {
        *filename = lydict_insert(ctx, path, len);
    }
#endif
}